

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall
test_timestep_embedding::build_graph(test_timestep_embedding *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  test_case *in_RSI;
  int64_t *in_RDI;
  ggml_tensor *out;
  ggml_tensor *a;
  undefined8 in_stack_ffffffffffffffe0;
  ggml_context *in_stack_ffffffffffffffe8;
  
  std::array<long,_4UL>::data((array<long,_4UL> *)0x1a9841);
  pgVar1 = test_case::ggml_new_tensor
                     (in_RSI,in_stack_ffffffffffffffe8,
                      (ggml_type)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                      (int)in_stack_ffffffffffffffe0,in_RDI);
  ggml_set_name(pgVar1,"a");
  pgVar1 = (ggml_tensor *)
           ggml_timestep_embedding
                     (in_RSI,pgVar1,(int)in_RDI[0xc],*(undefined4 *)((long)in_RDI + 100));
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne_a.data());
        ggml_set_name(a, "a");

        ggml_tensor * out = ggml_timestep_embedding(ctx, a, dim, max_period);
        ggml_set_name(out, "out");

        return out;
    }